

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O3

cmUVProcessChain __thiscall cmUVProcessChainBuilder::Start(cmUVProcessChainBuilder *this)

{
  bool bVar1;
  StdioConfiguration this_00;
  long lVar2;
  ulong uVar3;
  pointer pPVar4;
  pointer *__ptr;
  cmUVProcessChainBuilder *in_RSI;
  size_t index;
  
  this_00 = (StdioConfiguration)operator_new(0xb0);
  memset((void *)this_00,0,0x98);
  ((StreamData *)((long)this_00 + 0x28))->BuiltinStream = -1;
  ((StreamData *)((long)this_00 + 0x40))->BuiltinStream = -1;
  ((StreamData *)((long)this_00 + 0x58))->BuiltinStream = -1;
  (((vector<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
     *)((long)this_00 + 0x98))->
  super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)((long)this_00 + 0xa0) = (pointer)0x0;
  *(pointer *)((long)this_00 + 0xa8) = (pointer)0x0;
  (((uv_pipe_ptr *)((long)this_00 + 0x70))->super_uv_handle_ptr_<uv_pipe_s>).
  super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)this_00 + 0x78))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((uv_pipe_ptr *)((long)this_00 + 0x80))->super_uv_handle_ptr_<uv_pipe_s>).
  super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)this_00 + 0x88))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(uint *)((long)this_00 + 0x90) = 0;
  (this->Stdio)._M_elems[0] = this_00;
  bVar1 = cmUVProcessChain::InternalData::Prepare((InternalData *)this_00,in_RSI);
  if (bVar1) {
    pPVar4 = (in_RSI->Processes).
             super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = (long)(in_RSI->Processes).
                  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4;
    if (lVar2 != 0) {
      uVar3 = (lVar2 >> 3) * -0x5555555555555555;
      lVar2 = 0;
      index = 0;
      do {
        cmUVProcessChain::InternalData::SpawnProcess
                  ((InternalData *)this_00,index,
                   (ProcessConfiguration *)
                   ((long)&(pPVar4->Arguments).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + lVar2),index == 0,index == uVar3 - 1);
        index = index + 1;
        pPVar4 = (in_RSI->Processes).
                 super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = ((long)(in_RSI->Processes).
                       super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
                -0x5555555555555555;
        lVar2 = lVar2 + 0x18;
      } while (index < uVar3);
    }
    cm::uv_handle_ptr_base_<uv_pipe_s>::reset
              ((uv_handle_ptr_base_<uv_pipe_s> *)((long)this_00 + 0x70));
    cm::uv_handle_ptr_base_<uv_pipe_s>::reset
              ((uv_handle_ptr_base_<uv_pipe_s> *)((long)this_00 + 0x80));
    *(bool *)((long)this_00 + 8) = true;
  }
  return (unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          )(unique_ptr<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
            )this;
}

Assistant:

cmUVProcessChain cmUVProcessChainBuilder::Start() const
{
  cmUVProcessChain chain;

  if (!chain.Data->Prepare(this)) {
    return chain;
  }

  for (std::size_t i = 0; i < this->Processes.size(); i++) {
    chain.Data->SpawnProcess(i, this->Processes[i], i == 0,
                             i == this->Processes.size() - 1);
  }

  chain.Data->Finish();

  return chain;
}